

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O3

void __thiscall
Assimp::MD5::MD5CameraParser::MD5CameraParser(MD5CameraParser *this,SectionList *mSections)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  CameraFrameList *this_01;
  pointer *ppuVar1;
  string *psVar2;
  iterator __position;
  pointer pEVar3;
  iterator __position_00;
  MD5CameraParser *pMVar4;
  byte bVar5;
  int iVar6;
  Logger *pLVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  char cVar11;
  Element *elem_1;
  pointer pCVar12;
  pointer pEVar13;
  size_type sVar14;
  pointer pSVar15;
  Element *elem;
  byte *pbVar16;
  byte *pbVar17;
  CameraAnimFrameDesc local_78;
  MD5CameraParser *local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  this_00 = &this->cuts;
  this_01 = &this->frames;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"MD5CameraParser begin");
  this->fFrameRate = 24.0;
  pSVar15 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  local_40 = (mSections->
             super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  pMVar4 = this;
  if (pSVar15 != local_40) {
    do {
      local_50 = pMVar4;
      psVar2 = &pSVar15->mName;
      iVar6 = std::__cxx11::string::compare((char *)psVar2);
      local_48 = pSVar15;
      if (iVar6 == 0) {
        pcVar9 = (pSVar15->mGlobalValue)._M_dataplus._M_p;
        cVar11 = *pcVar9;
        if ((byte)(cVar11 - 0x3aU) < 0xf6) {
          sVar14 = 0;
        }
        else {
          uVar10 = 0;
          do {
            pcVar9 = pcVar9 + 1;
            uVar10 = (uint)(byte)(cVar11 - 0x30) + uVar10 * 10;
            cVar11 = *pcVar9;
          } while (0xf5 < (byte)(cVar11 - 0x3aU));
          sVar14 = (size_type)uVar10;
        }
        std::
        vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
        ::reserve(this_01,sVar14);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ =
               local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
          fast_atoreal_move<float>((pSVar15->mGlobalValue)._M_dataplus._M_p,(float *)&local_78,true)
          ;
          this->fFrameRate = local_78.super_BaseFrameDesc.vPositionXYZ.x;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)psVar2);
          if (iVar6 == 0) {
            pcVar9 = (pSVar15->mGlobalValue)._M_dataplus._M_p;
            cVar11 = *pcVar9;
            if ((byte)(cVar11 - 0x3aU) < 0xf6) {
              sVar14 = 0;
            }
            else {
              uVar10 = 0;
              do {
                pcVar9 = pcVar9 + 1;
                uVar10 = (uint)(byte)(cVar11 - 0x30) + uVar10 * 10;
                cVar11 = *pcVar9;
              } while (0xf5 < (byte)(cVar11 - 0x3aU));
              sVar14 = (size_type)uVar10;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,sVar14);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)psVar2);
            if (iVar6 == 0) {
              pEVar3 = (pSVar15->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pEVar13 = (pSVar15->mElements).
                             super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                             ._M_impl.super__Vector_impl_data._M_start; pEVar13 != pEVar3;
                  pEVar13 = pEVar13 + 1) {
                pcVar9 = pEVar13->szStart;
                cVar11 = *pcVar9;
                uVar10 = 1;
                if (0xf5 < (byte)(cVar11 - 0x3aU)) {
                  iVar6 = 0;
                  do {
                    pcVar9 = pcVar9 + 1;
                    iVar6 = (uint)(byte)(cVar11 - 0x30) + iVar6 * 10;
                    cVar11 = *pcVar9;
                  } while (0xf5 < (byte)(cVar11 - 0x3aU));
                  uVar10 = iVar6 + 1;
                }
                local_78.super_BaseFrameDesc.vPositionXYZ.x = (float)uVar10;
                __position_00._M_current =
                     (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(this_00,__position_00,(uint *)&local_78);
                }
                else {
                  *__position_00._M_current = uVar10;
                  ppuVar1 = &(this->cuts).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                  *ppuVar1 = *ppuVar1 + 1;
                }
              }
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)psVar2);
              if (iVar6 == 0) {
                pEVar13 = (local_48->mElements).
                          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_38 = (local_48->mElements).
                           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                if (pEVar13 != local_38) {
                  do {
                    pbVar17 = (byte *)pEVar13->szStart;
                    local_78.super_BaseFrameDesc.vRotationQuat.y = 0.0;
                    local_78.super_BaseFrameDesc.vRotationQuat.z = 0.0;
                    local_78.fFOV = 0.0;
                    local_78.super_BaseFrameDesc.vPositionXYZ.x = 0.0;
                    local_78.super_BaseFrameDesc.vPositionXYZ.y = 0.0;
                    local_78.super_BaseFrameDesc.vPositionXYZ.z = 0.0;
                    local_78.super_BaseFrameDesc.vRotationQuat.x = 0.0;
                    __position._M_current =
                         (this->frames).
                         super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this->frames).
                        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ::_M_realloc_insert<Assimp::MD5::CameraAnimFrameDesc>
                                (this_01,__position,&local_78);
                      pCVar12 = (local_50->frames).
                                super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    else {
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vRotationQuat.z
                           = 0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.z
                           = 0;
                      pCVar12 = (this->frames).
                                super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1;
                      (this->frames).
                      super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish = pCVar12;
                    }
                    pbVar16 = pbVar17;
                    while( true ) {
                      pbVar16 = pbVar16 + 1;
                      bVar5 = *pbVar17;
                      uVar8 = (ulong)bVar5;
                      if (0x20 < uVar8) break;
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                          bVar5 = *pbVar17;
                        }
                        break;
                      }
                      pbVar17 = pbVar17 + 1;
                    }
                    if (bVar5 != 0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar13->iLineNumber);
                    }
                    for (; uVar8 = (ulong)*pbVar16, uVar8 < 0x21; pbVar16 = pbVar16 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar17 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar16,(float *)(pCVar12 + -1),true);
                        uVar8 = (ulong)*pbVar17, uVar8 < 0x21; pbVar17 = pbVar17 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar17 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar17,
                                                      &pCVar12[-1].super_BaseFrameDesc.vPositionXYZ.
                                                       y,true); uVar8 = (ulong)*pbVar17,
                        uVar8 < 0x21; pbVar17 = pbVar17 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    pbVar17 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar17,
                                                 &pCVar12[-1].super_BaseFrameDesc.vPositionXYZ.z,
                                                 true);
                    pbVar16 = pbVar17 + 2;
                    while( true ) {
                      bVar5 = *pbVar17;
                      uVar8 = (ulong)bVar5;
                      if (0x20 < uVar8) break;
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                          bVar5 = *pbVar17;
                        }
                        break;
                      }
                      pbVar17 = pbVar17 + 1;
                      pbVar16 = pbVar16 + 1;
                    }
                    if (bVar5 != 0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar13->iLineNumber);
                    }
                    while( true ) {
                      bVar5 = pbVar16[-1];
                      uVar8 = (ulong)bVar5;
                      if (0x20 < uVar8) break;
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                          bVar5 = pbVar16[-1];
                        }
                        break;
                      }
                      pbVar16 = pbVar16 + 1;
                    }
                    if (bVar5 != 0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar13->iLineNumber);
                    }
                    for (; uVar8 = (ulong)*pbVar16, uVar8 < 0x21; pbVar16 = pbVar16 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar17 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar16,
                                                      &pCVar12[-1].super_BaseFrameDesc.vRotationQuat
                                                       .x,true); uVar8 = (ulong)*pbVar17,
                        uVar8 < 0x21; pbVar17 = pbVar17 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar17 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar17,
                                                      &pCVar12[-1].super_BaseFrameDesc.vRotationQuat
                                                       .y,true); uVar8 = (ulong)*pbVar17,
                        uVar8 < 0x21; pbVar17 = pbVar17 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    pbVar16 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar17,
                                                 &pCVar12[-1].super_BaseFrameDesc.vRotationQuat.z,
                                                 true);
                    pbVar17 = pbVar16;
                    while( true ) {
                      pbVar16 = pbVar16 + 1;
                      bVar5 = *pbVar17;
                      uVar8 = (ulong)bVar5;
                      if (0x20 < uVar8) break;
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                          bVar5 = *pbVar17;
                        }
                        break;
                      }
                      pbVar17 = pbVar17 + 1;
                    }
                    if (bVar5 != 0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar13->iLineNumber);
                    }
                    for (; uVar8 = (ulong)*pbVar16, uVar8 < 0x21; pbVar16 = pbVar16 + 1) {
                      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar13->iLineNumber);
                        }
                        break;
                      }
                    }
                    local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ =
                         local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
                    fast_atoreal_move<float>((char *)pbVar16,(float *)&local_78,true);
                    pCVar12[-1].fFOV = local_78.super_BaseFrameDesc.vPositionXYZ.x;
                    pEVar13 = pEVar13 + 1;
                    this = local_50;
                  } while (pEVar13 != local_38);
                }
              }
            }
          }
        }
      }
      pSVar15 = local_48 + 1;
      pMVar4 = local_50;
    } while (pSVar15 != local_40);
  }
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"MD5CameraParser end");
  return;
}

Assistant:

MD5CameraParser::MD5CameraParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5CameraParser begin");
    fFrameRate = 24.0f;

    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "numFrames")   {
            frames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "frameRate")  {
            fFrameRate = fast_atof ((*iter).mGlobalValue.c_str());
        }
        else if ((*iter).mName == "numCuts")    {
            cuts.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "cuts")   {
            for (const auto & elem : (*iter).mElements){
                cuts.push_back(strtoul10(elem.szStart)+1);
            }
        }
        else if ((*iter).mName == "camera") {
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                frames.push_back(CameraAnimFrameDesc());
                CameraAnimFrameDesc& cur = frames.back();
                AI_MD5_READ_TRIPLE(cur.vPositionXYZ);
                AI_MD5_READ_TRIPLE(cur.vRotationQuat);
                AI_MD5_SKIP_SPACES();
                cur.fFOV = fast_atof(sz);
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5CameraParser end");
}